

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Js::RecyclableObject_*,_RealCount>::Clear<Memory::HeapAllocator>
          (DListBase<Js::RecyclableObject_*,_RealCount> *this,HeapAllocator *allocator)

{
  DListNodeBase<Js::RecyclableObject_*> *pDVar1;
  bool bVar2;
  DListNodeBase<Js::RecyclableObject_*> **ppDVar3;
  NodeBase *next;
  NodeBase *current;
  HeapAllocator *allocator_local;
  DListBase<Js::RecyclableObject_*,_RealCount> *this_local;
  
  ppDVar3 = DListNodeBase<Js::RecyclableObject_*>::Next
                      (&this->super_DListNodeBase<Js::RecyclableObject_*>);
  next = *ppDVar3;
  while( true ) {
    bVar2 = IsHead(this,next);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppDVar3 = DListNodeBase<Js::RecyclableObject_*>::Next(next);
    pDVar1 = *ppDVar3;
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Js::RecyclableObject*>>
              (allocator,(DListNode<Js::RecyclableObject_*> *)next);
    next = pDVar1;
  }
  ppDVar3 = DListNodeBase<Js::RecyclableObject_*>::Next
                      (&this->super_DListNodeBase<Js::RecyclableObject_*>);
  *ppDVar3 = &this->super_DListNodeBase<Js::RecyclableObject_*>;
  ppDVar3 = DListNodeBase<Js::RecyclableObject_*>::Prev
                      (&this->super_DListNodeBase<Js::RecyclableObject_*>);
  *ppDVar3 = &this->super_DListNodeBase<Js::RecyclableObject_*>;
  RealCount::SetCount(&this->super_RealCount,0);
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }